

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O2

void __thiscall CConsole::DeregisterTempMap(CConsole *this,char *pName)

{
  CMapListEntryTemp **ppCVar1;
  CMapListEntryTemp *pCVar2;
  CMapListEntryTemp *pCVar3;
  CHeap *this_00;
  int iVar4;
  CHeap *this_01;
  CMapListEntryTemp *pCVar5;
  CMapListEntryTemp **ppCVar6;
  
  if (this->m_pFirstMapEntry != (CMapListEntryTemp *)0x0) {
    this_01 = (CHeap *)operator_new(8);
    CHeap::CHeap(this_01);
    ppCVar1 = &this->m_pFirstMapEntry;
    ppCVar6 = ppCVar1;
    while (pCVar2 = *ppCVar6, pCVar2 != (CMapListEntryTemp *)0x0) {
      iVar4 = str_comp_nocase(pName,pCVar2->m_aName);
      if (iVar4 != 0) {
        pCVar5 = (CMapListEntryTemp *)CHeap::Allocate(this_01,0x30);
        pCVar5->m_pNext = (CMapListEntryTemp *)0x0;
        pCVar3 = this->m_pLastMapEntry;
        pCVar5->m_pPrev = pCVar3;
        if (pCVar3 != (CMapListEntryTemp *)0x0) {
          pCVar3->m_pNext = pCVar5;
        }
        this->m_pLastMapEntry = pCVar5;
        if (this->m_pFirstMapEntry == (CMapListEntryTemp *)0x0) {
          *ppCVar1 = pCVar5;
        }
        str_copy(pCVar5->m_aName,pCVar2->m_aName,0x20);
      }
      ppCVar6 = &pCVar2->m_pNext;
    }
    this_00 = this->m_pTempMapListHeap;
    if (this_00 != (CHeap *)0x0) {
      CHeap::~CHeap(this_00);
    }
    operator_delete(this_00,8);
    this->m_pTempMapListHeap = this_01;
    *ppCVar1 = (CMapListEntryTemp *)0x0;
    this->m_pLastMapEntry = (CMapListEntryTemp *)0x0;
  }
  return;
}

Assistant:

void CConsole::DeregisterTempMap(const char *pName)
{
	if(!m_pFirstMapEntry)
		return;

	CHeap *pNewTempMapListHeap = new CHeap();
	CMapListEntryTemp *pNewFirstEntry = 0;
	CMapListEntryTemp *pNewLastEntry = 0;

	for(CMapListEntryTemp *pSrc = m_pFirstMapEntry; pSrc; pSrc = pSrc->m_pNext)
	{
		if(str_comp_nocase(pName, pSrc->m_aName) == 0)
			continue;

		CMapListEntryTemp *pDst = (CMapListEntryTemp *)pNewTempMapListHeap->Allocate(sizeof(CMapListEntryTemp));
		pDst->m_pNext = 0;
		pDst->m_pPrev = m_pLastMapEntry;
		if(pDst->m_pPrev)
			pDst->m_pPrev->m_pNext = pDst;
		m_pLastMapEntry = pDst;
		if(!m_pFirstMapEntry)
			m_pFirstMapEntry = pDst;

		str_copy(pDst->m_aName, pSrc->m_aName, TEMPMAP_NAME_LENGTH);
	}

	delete m_pTempMapListHeap;
	m_pTempMapListHeap = pNewTempMapListHeap;
	m_pFirstMapEntry = pNewFirstEntry;
	m_pLastMapEntry = pNewLastEntry;
}